

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_ransac.cpp
# Opt level: O2

int main(void)

{
  initializer_list<Point2D> __l;
  double best_error;
  LineModel best_model;
  vector<Point2D,_std::allocator<Point2D>_> Point_sets;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> best_consensus_set;
  
  best_consensus_set._M_t._M_impl._0_8_ = 0x4008000000000000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0x40100000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x4018000000000000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x4020000000000000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x4022000000000000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0x4028000000000000;
  __l._M_len = 5;
  __l._M_array = (iterator)&best_consensus_set;
  std::vector<Point2D,_std::allocator<Point2D>_>::vector
            (&Point_sets,__l,(allocator_type *)&best_model);
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       best_consensus_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  runRansac(&Point_sets,2,0x32,0.01,
            (int)((double)(int)((ulong)((long)Point_sets.
                                              super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)Point_sets.
                                             super__Vector_base<Point2D,_std::allocator<Point2D>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 4) * 0.5),
            &best_model,&best_consensus_set,&best_error);
  LineModel::printLineParam(&best_model);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&best_consensus_set._M_t);
  std::_Vector_base<Point2D,_std::allocator<Point2D>_>::~_Vector_base
            (&Point_sets.super__Vector_base<Point2D,_std::allocator<Point2D>_>);
  return 0;
}

Assistant:

int main() {

	vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 8), Point2D(9, 12), Point2D(15, 20), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(3, 7), Point2D(10,-10) };
        //vector<Point2D> Point_sets{ Point2D(3, 4), Point2D(6, 4), Point2D(9, 4), Point2D(15, 4), Point2D(10,-10) };
	int data_size = Point_sets.size();
	//2.设置输入量
	int maxIterations = 50;   //最大迭代次数
	int n = 2;                //模型自由度
	double t = 0.01;        //用于决定数据是否适应于模型的阀值
	int d = data_size * 0.5; //判定模型是否适用于数据集的数据数目
	//3.初始化输出量
	LineModel best_model;            //最佳线性模型
	set<size_t> best_consensus_set;  //记录一致点索引的set
	double best_error;              //最小残差
	//4.运行RANSAC            
	int status = runRansac(Point_sets, n, maxIterations, t, d, best_model, best_consensus_set, best_error);
	//5.输出
	best_model.printLineParam();
	return 0;
}